

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-close.c
# Opt level: O1

int run_test_shutdown_close_pipe(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  uv_shutdown_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t h;
  void *local_100;
  uv_shutdown_t local_f8 [2];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&local_f8[0].loop,0);
  local_f8[0].data = (void *)(long)iVar1;
  local_100 = (void *)0x0;
  if (local_f8[0].data == (void *)0x0) {
    uv_pipe_connect(&connect_req,&local_f8[0].loop,"/tmp/uv-test-sock",connect_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    local_f8[0].data = (void *)(long)iVar1;
    local_100 = (void *)0x0;
    if (local_f8[0].data != (void *)0x0) goto LAB_001bad25;
    local_f8[0].data = (void *)0x1;
    local_100 = (void *)(long)connect_cb_called;
    if (local_100 != (void *)0x1) goto LAB_001bad34;
    local_f8[0].data = (void *)0x1;
    local_100 = (void *)(long)shutdown_cb_called;
    if (local_100 != (void *)0x1) goto LAB_001bad43;
    local_f8[0].data = (void *)0x1;
    local_100 = (void *)(long)close_cb_called;
    if (local_100 == (void *)0x1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_f8[0].data = (void *)0x0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      local_100 = (void *)(long)iVar1;
      if (local_f8[0].data == local_100) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001bad61;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_001bad25:
    run_test_shutdown_close_pipe_cold_2();
LAB_001bad34:
    run_test_shutdown_close_pipe_cold_3();
LAB_001bad43:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_001bad61:
  puVar3 = local_f8;
  iVar1 = (int)&local_100;
  run_test_shutdown_close_pipe_cold_6();
  if (puVar3 == &shutdown_req) {
    if ((iVar1 == -0x7d) || (iVar1 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(shutdown_close_pipe) {
  uv_pipe_t h;
  int r;

  r = uv_pipe_init(uv_default_loop(), &h, 0);
  ASSERT_OK(r);
  uv_pipe_connect(&connect_req, &h, TEST_PIPENAME, connect_cb);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}